

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
 __thiscall
spvtools::
MakeUnique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (spvtools *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *args)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *args_local;
  
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)::operator_new(0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,args);
  std::
  unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)this,this_00);
  return (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}